

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderTessellationMaxInOut::compareValues
          (TessellationShaderTessellationMaxInOut *this,char *description,GLfloat *reference_values,
          int n_reference_values)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  float fVar5;
  MessageBuilder local_1d0;
  int local_4c;
  byte local_45;
  int i;
  bool test_passed;
  long lStack_40;
  GLfloat epsilon;
  GLfloat *resultFloats;
  long lStack_30;
  GLint bo_size;
  Functions *gl;
  GLfloat *pGStack_20;
  int n_reference_values_local;
  GLfloat *reference_values_local;
  char *description_local;
  TessellationShaderTessellationMaxInOut *this_local;
  
  gl._4_4_ = n_reference_values;
  pGStack_20 = reference_values;
  reference_values_local = (GLfloat *)description;
  description_local = (char *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  resultFloats._4_4_ = gl._4_4_ << 5;
  lStack_40 = (**(code **)(lStack_30 + 0xd00))(0x8c8e,0,(long)resultFloats._4_4_,1);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb29);
  i = 0x3727c5ac;
  local_45 = 1;
  local_4c = 0;
  do {
    if (gl._4_4_ * 4 <= local_4c) {
LAB_016256f1:
      (**(code **)(lStack_30 + 0x1670))(0x8c8e);
      dVar2 = (**(code **)(lStack_30 + 0x800))();
      glu::checkError(dVar2,"glUnmapBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0xb44);
      return (bool)(local_45 & 1);
    }
    fVar5 = de::abs<float>(*(float *)(lStack_40 + (long)local_4c * 4) - pGStack_20[local_4c]);
    if (1e-05 < fVar5) {
LAB_016253e0:
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1d0,(char **)&reference_values_local);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])": captured results ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b6cfbc);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)(lStack_40 + (long)local_4c * 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)(lStack_40 + (long)(local_4c + 1) * 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)(lStack_40 + (long)(local_4c + 2) * 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)(lStack_40 + (long)(local_4c + 3) * 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b47c71);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [40])"are different from the expected values ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b6cfbc);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGStack_20 + local_4c);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGStack_20 + (local_4c + 1));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGStack_20 + (local_4c + 2));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGStack_20 + (local_4c + 3));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c156ab);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      local_45 = 0;
      goto LAB_016256f1;
    }
    fVar5 = de::abs<float>(*(float *)(lStack_40 + (long)(local_4c + 1) * 4) -
                           pGStack_20[local_4c + 1]);
    if (1e-05 < fVar5) goto LAB_016253e0;
    fVar5 = de::abs<float>(*(float *)(lStack_40 + (long)(local_4c + 2) * 4) -
                           pGStack_20[local_4c + 2]);
    if (1e-05 < fVar5) goto LAB_016253e0;
    fVar5 = de::abs<float>(*(float *)(lStack_40 + (long)(local_4c + 3) * 4) -
                           pGStack_20[local_4c + 3]);
    if (1e-05 < fVar5) goto LAB_016253e0;
    local_4c = local_4c + 4;
  } while( true );
}

Assistant:

bool TessellationShaderTessellationMaxInOut::compareValues(char const* description, glw::GLfloat* reference_values,
														   int n_reference_values)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Map the buffer storage into process space. */
	glw::GLint bo_size = static_cast<glw::GLint>(2 /* number of vertices */ * sizeof(glw::GLfloat) *
												 n_reference_values * 4); /* number of components */
	glw::GLfloat* resultFloats =
		(glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Verify the data */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_passed = true;

	for (int i = 0; i < n_reference_values * 4 /* number of components */; i += 4 /* number of components */)
	{
		if ((de::abs(resultFloats[i] - reference_values[i]) > epsilon) ||
			(de::abs(resultFloats[i + 1] - reference_values[i + 1]) > epsilon) ||
			(de::abs(resultFloats[i + 2] - reference_values[i + 2]) > epsilon) ||
			(de::abs(resultFloats[i + 3] - reference_values[i + 3]) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << description << ": captured results "
							   << "vec4(" << resultFloats[i + 0] << ", " << resultFloats[i + 1] << ", "
							   << resultFloats[i + 2] << ", " << resultFloats[i + 3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << reference_values[i + 0] << ", " << reference_values[i + 1] << ", "
							   << reference_values[i + 2] << ", " << reference_values[i + 3] << ")."
							   << tcu::TestLog::EndMessage;

			test_passed = false;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return test_passed;
}